

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
 __thiscall
phmap::priv::
base_checker<phmap::btree_multimap<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
::
riter_check<std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>const,std::pair<std::__cxx11::string_const,std::__cxx11::string>const&,std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>>,std::reverse_iterator<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
          (base_checker<phmap::btree_multimap<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
           *this,reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                 *tree_iter,
          reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *checker_iter)

{
  _Base_ptr p_Var1;
  reference x;
  reference y;
  reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RCX;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  const_iterator cVar3;
  reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
  rVar4;
  
  cVar3 = btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
          ::begin((btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
                   *)tree_iter);
  uVar2 = cVar3._8_8_;
  if (((checker_iter->current)._M_node == (_Base_ptr)cVar3.node) &&
     (*(int *)&checker_iter[1].current._M_node == cVar3.position)) {
    if ((in_RCX->current)._M_node != *(_Base_ptr *)&tree_iter[3].current.position) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                    ,0x87,
                    "IterType phmap::priv::base_checker<phmap::btree_multimap<std::basic_string<char>, std::basic_string<char>>, std::multimap<std::basic_string<char>, std::basic_string<char>>>::riter_check(IterType, CheckerIterType) const [TreeType = phmap::btree_multimap<std::basic_string<char>, std::basic_string<char>>, CheckerType = std::multimap<std::basic_string<char>, std::basic_string<char>>, IterType = std::reverse_iterator<phmap::priv::btree_iterator<const phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, true>>, const std::pair<const std::basic_string<char>, std::basic_string<char>> &, const std::pair<const std::basic_string<char>, std::basic_string<char>> *>>, CheckerIterType = std::reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const std::basic_string<char>, std::basic_string<char>>>>]"
                   );
    }
  }
  else {
    x = std::
        reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
        ::operator*((reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                     *)checker_iter);
    y = std::
        reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(in_RCX);
    (anonymous_namespace)::
    CheckPairEquals<std::__cxx11::string_const,std::__cxx11::string,std::__cxx11::string_const,std::__cxx11::string>
              (x,y);
    uVar2 = extraout_RDX;
  }
  p_Var1 = checker_iter[1].current._M_node;
  *(_Base_ptr *)this = (checker_iter->current)._M_node;
  *(_Base_ptr *)(this + 8) = p_Var1;
  rVar4.current._8_8_ = uVar2;
  rVar4.current.node =
       (btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
        *)this;
  return (reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
          )rVar4.current;
}

Assistant:

IterType riter_check(IterType tree_iter, CheckerIterType checker_iter) const {
        if (tree_iter == tree_.rend()) {
            PHMAP_INTERNAL_CHECK(checker_iter == checker_.rend(),
                                 "Checker iterator not at rend.");
        } else {
            CheckPairEquals(*tree_iter, *checker_iter);
        }
        return tree_iter;
    }